

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O3

void __thiscall
QTriangulator<unsigned_int>::SimpleToMonotone::classifyVertex(SimpleToMonotone *this,int i)

{
  Edge *pEVar1;
  QPodPoint *pQVar2;
  VertexType VVar3;
  long lVar4;
  byte bVar5;
  byte bVar6;
  
  pEVar1 = (this->m_edges).buffer;
  bVar6 = (pEVar1[i].pointingUp ^ 1U) & pEVar1[pEVar1[i].previous].pointingUp;
  bVar5 = (pEVar1[pEVar1[i].previous].pointingUp ^ 1U) & pEVar1[i].pointingUp;
  pQVar2 = (this->m_parent->m_vertices).buffer;
  lVar4 = ((long)pQVar2[pEVar1[pEVar1[i].previous].from].y - (long)pQVar2[pEVar1[i].from].y) *
          ((long)pQVar2[pEVar1[i].to].x - (long)pQVar2[pEVar1[i].from].x) -
          ((long)pQVar2[pEVar1[pEVar1[i].previous].from].x - (long)pQVar2[pEVar1[i].from].x) *
          ((long)pQVar2[pEVar1[i].to].y - (long)pQVar2[pEVar1[i].from].y);
  pEVar1[i].type = RegularVertex;
  if (this->m_clockwiseOrder == true) {
    if (bVar6 == 0) {
      if (bVar5 == 0) {
        return;
      }
      VVar3 = (VertexType)(-1 < lVar4);
    }
    else {
      VVar3 = StartVertex - (int)(lVar4 >> 0x3f);
    }
  }
  else if (bVar6 == 0) {
    if (bVar5 == 0) {
      return;
    }
    VVar3 = (VertexType)(lVar4 < 1);
  }
  else {
    VVar3 = (0 < lVar4) + StartVertex;
  }
  pEVar1[i].type = VVar3;
  return;
}

Assistant:

void QTriangulator<T>::SimpleToMonotone::classifyVertex(int i)
{
    Edge &e2 = m_edges.at(i);
    const Edge &e1 = m_edges.at(e2.previous);

    bool startOrSplit = (e1.pointingUp && !e2.pointingUp);
    bool endOrMerge = (!e1.pointingUp && e2.pointingUp);

    const QPodPoint &p1 = m_parent->m_vertices.at(e1.from);
    const QPodPoint &p2 = m_parent->m_vertices.at(e2.from);
    const QPodPoint &p3 = m_parent->m_vertices.at(e2.to);
    qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(p1, p2, p3);
    Q_ASSERT(d != 0 || (!startOrSplit && !endOrMerge));

    e2.type = RegularVertex;

    if (m_clockwiseOrder) {
        if (startOrSplit)
            e2.type = (d < 0 ? SplitVertex : StartVertex);
        else if (endOrMerge)
            e2.type = (d < 0 ? MergeVertex : EndVertex);
    } else {
        if (startOrSplit)
            e2.type = (d > 0 ? SplitVertex : StartVertex);
        else if (endOrMerge)
            e2.type = (d > 0 ? MergeVertex : EndVertex);
    }
}